

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyGC.cpp
# Opt level: O1

void __thiscall TinyGC::AttachMainThread(TinyGC *this)

{
  undefined8 *puVar1;
  pthread_t pVar2;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lck;
  
  local_28 = (undefined1  [8])&this->ts_mxt_;
  lck._M_device._0_1_ = 0;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_28);
  lck._M_device._0_1_ = 1;
  puVar1 = (undefined8 *)operator_new(0x20);
  puVar1[1] = 0;
  *(undefined1 *)(puVar1 + 2) = 1;
  pVar2 = pthread_self();
  puVar1[3] = pVar2;
  *puVar1 = ___libc_stack_end;
  std::
  _Hashtable<std::thread::id,std::pair<std::thread::id_const,TinyGC::ThreadState*>,std::allocator<std::pair<std::thread::id_const,TinyGC::ThreadState*>>,std::__detail::_Select1st,std::equal_to<std::thread::id>,std::hash<std::thread::id>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<std::thread::id,TinyGC::ThreadState*>>
            ((_Hashtable<std::thread::id,std::pair<std::thread::id_const,TinyGC::ThreadState*>,std::allocator<std::pair<std::thread::id_const,TinyGC::ThreadState*>>,std::__detail::_Select1st,std::equal_to<std::thread::id>,std::hash<std::thread::id>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->thread_to_stack_);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void TinyGC::AttachMainThread() {
  std::unique_lock<std::mutex> lck(ts_mxt_);
  auto thread_state = new ThreadState(true);
  thread_to_stack_.insert(std::pair<std::thread::id, ThreadState *>(
      thread_state->GetThreadId(), thread_state));
  // LOG("main thread~");
  // LOG("stack start address " << thread_state->GetStackStartAddr());
  // LOG("stack end address " << thread_state->GetStackEndAddr());
}